

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

size_t read_padding(AV1_COMMON *cm,uint8_t *data,size_t sz)

{
  uint8_t uVar1;
  size_t in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  uint8_t last_nonzero_byte;
  size_t local_8;
  
  local_8 = in_RDX;
  if ((in_RDX != 0) && (uVar1 = get_last_nonzero_byte(in_RSI,in_RDX), uVar1 != 0x80)) {
    **(undefined4 **)(in_RDI + 0x30) = 7;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t read_padding(AV1_COMMON *const cm, const uint8_t *data,
                           size_t sz) {
  // The spec allows a padding OBU to be header-only (i.e., obu_size = 0). So
  // check trailing bits only if sz > 0.
  if (sz > 0) {
    // The payload of a padding OBU is byte aligned. Therefore the first
    // trailing byte should be 0x80. See https://crbug.com/aomedia/2393.
    const uint8_t last_nonzero_byte = get_last_nonzero_byte(data, sz);
    if (last_nonzero_byte != 0x80) {
      cm->error->error_code = AOM_CODEC_CORRUPT_FRAME;
      return 0;
    }
  }
  return sz;
}